

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListLambdaBindData::Deserialize(Deserializer *deserializer,ScalarFunction *param_2)

{
  char cVar1;
  bool has_index;
  bool has_initial;
  ListLambdaBindData *this;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  LogicalType return_type;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_48;
  Deserializer local_40 [24];
  
  (**(code **)(*(long *)param_2 + 0x10))(param_2,100,"return_type");
  (**(code **)(*(long *)param_2 + 0x30))(param_2);
  duckdb::LogicalType::Deserialize(local_40);
  (**(code **)(*(long *)param_2 + 0x38))(param_2);
  (**(code **)(*(long *)param_2 + 0x18))(param_2);
  cVar1 = (**(code **)(*(long *)param_2 + 0x20))(param_2,0x65,"lambda_expr");
  _Var2._M_head_impl = (Expression *)0x0;
  if (cVar1 == '\0') {
    (**(code **)(*(long *)param_2 + 0x28))(param_2,0);
  }
  else {
    cVar1 = (**(code **)(*(long *)param_2 + 0x50))(param_2);
    if (cVar1 == '\0') {
      _Var2._M_head_impl = (Expression *)0x0;
    }
    else {
      (**(code **)(*(long *)param_2 + 0x30))(param_2);
      duckdb::Expression::Deserialize((Deserializer *)&local_48);
      (**(code **)(*(long *)param_2 + 0x38))(param_2);
      _Var2._M_head_impl = local_48._M_head_impl;
    }
    (**(code **)(*(long *)param_2 + 0x58))(param_2);
    (**(code **)(*(long *)param_2 + 0x28))(param_2,1);
  }
  (**(code **)(*(long *)param_2 + 0x10))(param_2,0x66,"has_index");
  has_index = (bool)(**(code **)(*(long *)param_2 + 0x60))(param_2);
  (**(code **)(*(long *)param_2 + 0x18))(param_2);
  (**(code **)(*(long *)param_2 + 0x10))(param_2,0x67,"has_initial");
  has_initial = (bool)(**(code **)(*(long *)param_2 + 0x60))(param_2);
  (**(code **)(*(long *)param_2 + 0x18))(param_2);
  this = (ListLambdaBindData *)operator_new(0x30);
  local_48._M_head_impl = _Var2._M_head_impl;
  ListLambdaBindData(this,(LogicalType *)local_40,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_48,has_index,has_initial);
  if (local_48._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  *(ListLambdaBindData **)deserializer = this;
  duckdb::LogicalType::~LogicalType((LogicalType *)local_40);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

unique_ptr<FunctionData> ListLambdaBindData::Deserialize(Deserializer &deserializer, ScalarFunction &) {
	auto return_type = deserializer.ReadProperty<LogicalType>(100, "return_type");
	auto lambda_expr = deserializer.ReadPropertyWithExplicitDefault<unique_ptr<Expression>>(101, "lambda_expr",
	                                                                                        unique_ptr<Expression>());
	auto has_index = deserializer.ReadProperty<bool>(102, "has_index");
	auto has_initial = deserializer.ReadProperty<bool>(103, "has_initial");
	return make_uniq<ListLambdaBindData>(return_type, std::move(lambda_expr), has_index, has_initial);
}